

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::Test_HtmlparserTest_TestFiles::Test_HtmlparserTest_TestFiles
          (Test_HtmlparserTest_TestFiles *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(HtmlparserTest, TestFiles) {
  HtmlparserCppTest tester;
  for (vector<string>::const_iterator it = g_filenames.begin();
       it != g_filenames.end(); ++it) {
    tester.SetUp();
    tester.ValidateFile(*it);
    tester.TearDown();
  }
}